

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringComparison.h
# Opt level: O2

int Assimp::ASSIMP_stricmp(char *s1,char *s2)

{
  int iVar1;
  
  if (s1 == (char *)0x0) {
    __assert_fail("__null != s1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/include/assimp/StringComparison.h"
                  ,0x8a,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
  }
  if (s2 != (char *)0x0) {
    iVar1 = strcasecmp(s1,s2);
    return iVar1;
  }
  __assert_fail("__null != s2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/include/assimp/StringComparison.h"
                ,0x8b,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
}

Assistant:

AI_FORCE_INLINE
int ASSIMP_stricmp(const char *s1, const char *s2) {
    ai_assert( NULL != s1 );
    ai_assert( NULL != s2 );

#if (defined _MSC_VER)

    return ::_stricmp(s1,s2);
#elif defined( __GNUC__ )

    return ::strcasecmp(s1,s2);
#else

    char c1, c2;
    do  {
        c1 = tolower(*s1++);
        c2 = tolower(*s2++);
    }
    while ( c1 && (c1 == c2) );
    return c1 - c2;
#endif
}